

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O0

int QtMWidgets::FingerGeometry::width(void)

{
  int iVar1;
  double *pdVar2;
  double local_28 [3];
  double local_10;
  
  if (width()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&width()::w);
    if (iVar1 != 0) {
      QGuiApplication::primaryScreen();
      local_10 = (double)QScreen::logicalDotsPerInchX();
      QGuiApplication::primaryScreen();
      local_28[0] = (double)QScreen::physicalDotsPerInchX();
      pdVar2 = qMax<double>(&local_10,local_28);
      width::w = qRound(*pdVar2 * 0.393700787);
      __cxa_guard_release(&width()::w);
    }
  }
  return width::w;
}

Assistant:

int
FingerGeometry::width()
{
#ifdef Q_OS_ANDROID

	static const int w =
		qRound( qgetenv( "QT_ANDROID_THEME_DISPLAY_DPI" ).toDouble() *
			fingerSize );

	return w;

#else

	static const int w =
		qRound(
			(qreal) qMax( QApplication::primaryScreen()->logicalDotsPerInchX(),
				QApplication::primaryScreen()->physicalDotsPerInchX() ) *
			fingerSize );

	return w;

#endif
}